

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

void __thiscall Assimp::BVHLoader::~BVHLoader(BVHLoader *this)

{
  ~BVHLoader(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

BVHLoader::~BVHLoader()
{}